

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<kj::HttpInputStream::Request> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Request>::operator=
          (ExceptionOr<kj::HttpInputStream::Request> *this,
          ExceptionOr<kj::HttpInputStream::Request> *param_1)

{
  ExceptionOr<kj::HttpInputStream::Request> *param_1_local;
  ExceptionOr<kj::HttpInputStream::Request> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<kj::HttpInputStream::Request>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;